

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal2::PrintBytesInObjectTo(uchar *obj_bytes,size_t count,ostream *os)

{
  ostream *os_local;
  size_t count_local;
  uchar *obj_bytes_local;
  
  anon_unknown_26::PrintBytesInObjectToImpl(obj_bytes,count,os);
  return;
}

Assistant:

void PrintBytesInObjectTo(const unsigned char* obj_bytes, size_t count,
                          ostream* os) {
  PrintBytesInObjectToImpl(obj_bytes, count, os);
}